

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_lpf2_init(ma_lpf2_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                      ma_lpf2 *pLPF)

{
  void *local_40;
  void *pHeap;
  size_t heapSizeInBytes;
  ma_lpf2 *pmStack_28;
  ma_result result;
  ma_lpf2 *pLPF_local;
  ma_allocation_callbacks *pAllocationCallbacks_local;
  ma_lpf2_config *pConfig_local;
  
  pmStack_28 = pLPF;
  pLPF_local = (ma_lpf2 *)pAllocationCallbacks;
  pAllocationCallbacks_local = (ma_allocation_callbacks *)pConfig;
  heapSizeInBytes._4_4_ = ma_lpf2_get_heap_size(pConfig,(size_t *)&pHeap);
  pConfig_local._4_4_ = heapSizeInBytes._4_4_;
  if (heapSizeInBytes._4_4_ == MA_SUCCESS) {
    if (pHeap == (void *)0x0) {
      local_40 = (void *)0x0;
    }
    else {
      local_40 = ma_malloc((size_t)pHeap,(ma_allocation_callbacks *)pLPF_local);
      if (local_40 == (void *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    heapSizeInBytes._4_4_ =
         ma_lpf2_init_preallocated((ma_lpf2_config *)pAllocationCallbacks_local,local_40,pmStack_28)
    ;
    if (heapSizeInBytes._4_4_ == MA_SUCCESS) {
      (pmStack_28->bq)._ownsHeap = 1;
      pConfig_local._4_4_ = MA_SUCCESS;
    }
    else {
      ma_free(local_40,(ma_allocation_callbacks *)pLPF_local);
      pConfig_local._4_4_ = heapSizeInBytes._4_4_;
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_lpf2_init(const ma_lpf2_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_lpf2* pLPF)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_lpf2_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_lpf2_init_preallocated(pConfig, pHeap, pLPF);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pLPF->bq._ownsHeap = MA_TRUE;    /* <-- This will cause the biquad to take ownership of the heap and free it when it's uninitialized. */
    return MA_SUCCESS;
}